

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void raviX_ptrlist_iter_split_current(PtrListIterator *self)

{
  int iVar1;
  
  if (*(char *)self->__list == '\a') {
    raviX_ptrlist_split_node(self->__list);
    iVar1 = (int)*(char *)self->__list;
    if (iVar1 <= self->__nr) {
      self->__nr = self->__nr - iVar1;
      self->__list = self->__list->next_;
    }
  }
  return;
}

Assistant:

void raviX_ptrlist_iter_split_current(PtrListIterator *self)
{
	if (self->__list->nr_ == N_) {
		/* full so split */
		raviX_ptrlist_split_node(self->__list);
		if (self->__nr >= self->__list->nr_) {
			self->__nr -= self->__list->nr_;
			self->__list = self->__list->next_;
		}
	}
}